

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

void regen_measure_index(vmd_file_t *file)

{
  vmd_time_t vVar1;
  int iVar2;
  int dm;
  vmd_bst_node_t *i;
  vmd_bst_node_t *_cont_;
  vmd_bst_node_t *_node_;
  int local_20;
  int measure;
  vmd_time_t time;
  int ts;
  vmd_map_t *ts_map;
  vmd_file_t *file_local;
  
  vmd_bst_clear(&(file->measure_index).bst);
  measure = file->ctrl[0x58].default_value;
  local_20 = 0;
  _node_._4_4_ = 1;
  for (_cont_ = vmd_bst_node_child_most((vmd_bst_node_t *)(file->ctrl + 0x58),0); i = _cont_,
      _cont_ != (vmd_bst_node_t *)(file->ctrl + 0x58); _cont_ = vmd_bst_node_adj(_cont_,1)) {
    while (i != (vmd_bst_node_t *)0x0) {
      vVar1 = vmd_map_time(_cont_);
      iVar2 = measures(file,vVar1 - local_20,measure);
      measure = vmd_map_value(_cont_);
      local_20 = vmd_map_time(_cont_);
      _node_._4_4_ = iVar2 + _node_._4_4_;
      vmd_map_set(&file->measure_index,local_20,_node_._4_4_);
      i = (vmd_bst_node_t *)0x0;
    }
  }
  return;
}

Assistant:

static void
regen_measure_index(file_t *file)
{
	bst_clear(&file->measure_index.bst);
	map_t *ts_map = &file->ctrl[FCTRL_TIMESIG];
	int ts = ts_map->default_value;
	time_t time = 0;
	int measure = 1;
	BST_FOREACH (bst_node_t *i, &ts_map->bst) {
		int dm = measures(file, map_time(i) - time, ts);
		ts = map_value(i);
		time = map_time(i);
		measure += dm;
		map_set(&file->measure_index, time, measure);
	}
}